

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall Table::reindex(Table *this)

{
  pointer pbVar1;
  ssize_t sVar2;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_00;
  size_t in_RCX;
  long lVar3;
  int __fd;
  size_t j;
  ulong uVar4;
  void *local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  row;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  mmap;
  Record r;
  fstream file_stream;
  
  std::fstream::fstream(&file_stream);
  get_filename_abi_cxx11_((string *)&r,this);
  std::fstream::open((string *)&file_stream,(_Ios_Openmode)&r);
  std::__cxx11::string::~string((string *)&r);
  Record::Record(&r);
  local_438 = (void *)0x1;
  while( true ) {
    __fd = (int)&local_438 + 0x1f8;
    sVar2 = Record::read(&r,__fd,local_438,in_RCX);
    if (sVar2 < 1) break;
    Record::read(&r,__fd,local_438,in_RCX);
    Record::to_vector_abi_cxx11_(&row,&r);
    MultiMap::
    MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
    ::MultiMap(&mmap);
    lVar3 = 0;
    for (uVar4 = 0;
        pbVar1 = (this->columns).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this->columns).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar4 = uVar4 + 1) {
      this_00 = Index::operator[](&this->index,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3)
                                 );
      MultiMap::
      MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
      ::insert(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((row.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar3),(long *)&local_438);
      lVar3 = lVar3 + 0x20;
    }
    BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::~BPlusTree(&mmap.tree);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&row);
    local_438 = (void *)((long)local_438 + 1);
  }
  std::fstream::close();
  std::fstream::~fstream(&file_stream);
  return;
}

Assistant:

void Table::reindex() {
    std::fstream file_stream;
    file_stream.open(get_filename());
    Record r;
    for (long i = 1; r.read(file_stream, i) > 0; ++i) {
        r.read(file_stream, i);
        auto row = r.to_vector();
        MultiMap::MultiMap<std::string, long> mmap;
        for (size_t j = 0; j < columns.size(); ++j) {
            index[columns[j]].insert(row[j], i);
        }
    }
    file_stream.close();
}